

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall cnn::Model::project_weights(Model *this,float radius)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  pointer ppPVar3;
  pointer ppPVar4;
  long *plVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 in_XMM5 [16];
  
  if (project_weights::project_scratch == (float *)0x0) {
    project_weights::project_scratch =
         (float *)cnn_mm_malloc((long)(this->all_params).
                                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->all_params).
                                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 1,0x100);
  }
  ppPVar3 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppPVar3 == ppPVar4) {
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    uVar11 = 0;
    lVar13 = 0;
    do {
      plVar5 = *(long **)((long)ppPVar3 + lVar13 * 2);
      (**(code **)(*plVar5 + 8))(plVar5,(long)project_weights::project_scratch + lVar13);
      lVar13 = lVar13 + 4;
      uVar11 = uVar11 + 1;
      lVar8 = lVar12 + 8;
      lVar12 = lVar12 + 8;
    } while ((pointer)((long)ppPVar3 + lVar8) != ppPVar4);
  }
  if (uVar11 == 0) {
    dVar18 = 0.0;
  }
  else {
    auVar15 = vpbroadcastq_avx512f();
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = ZEXT1664(ZEXT816(0));
    do {
      auVar19 = auVar17;
      auVar17 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar17,auVar16);
      uVar7 = vpcmpuq_avx512f(auVar17,auVar15,2);
      pfVar1 = project_weights::project_scratch + uVar10;
      auVar14._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * (int)pfVar1[1];
      auVar14._0_4_ = (uint)((byte)uVar7 & 1) * (int)*pfVar1;
      auVar14._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * (int)pfVar1[2];
      auVar14._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * (int)pfVar1[3];
      auVar14._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * (int)pfVar1[4];
      auVar14._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * (int)pfVar1[5];
      auVar14._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * (int)pfVar1[6];
      auVar14._28_4_ = (uint)(byte)(uVar7 >> 7) * (int)pfVar1[7];
      auVar17 = vcvtps2pd_avx512f(auVar14);
      auVar17 = vaddpd_avx512f(auVar19,auVar17);
      uVar10 = uVar10 + 8;
    } while (((ulong)uVar11 + 7 & 0xfffffffffffffff8) != uVar10);
    bVar6 = (bool)((byte)uVar7 & 1);
    auVar15._0_8_ = (ulong)bVar6 * auVar17._0_8_ | (ulong)!bVar6 * auVar19._0_8_;
    bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar15._8_8_ = (ulong)bVar6 * auVar17._8_8_ | (ulong)!bVar6 * auVar19._8_8_;
    bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar6 * auVar17._16_8_ | (ulong)!bVar6 * auVar19._16_8_;
    bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar15._24_8_ = (ulong)bVar6 * auVar17._24_8_ | (ulong)!bVar6 * auVar19._24_8_;
    bVar6 = (bool)((byte)(uVar7 >> 4) & 1);
    auVar15._32_8_ = (ulong)bVar6 * auVar17._32_8_ | (ulong)!bVar6 * auVar19._32_8_;
    bVar6 = (bool)((byte)(uVar7 >> 5) & 1);
    auVar15._40_8_ = (ulong)bVar6 * auVar17._40_8_ | (ulong)!bVar6 * auVar19._40_8_;
    bVar6 = (bool)((byte)(uVar7 >> 6) & 1);
    auVar15._48_8_ = (ulong)bVar6 * auVar17._48_8_ | (ulong)!bVar6 * auVar19._48_8_;
    auVar15._56_8_ = (uVar7 >> 7) * auVar17._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar19._56_8_;
    auVar14 = vextractf64x4_avx512f(auVar15,1);
    auVar17 = vaddpd_avx512f(auVar15,ZEXT3264(auVar14));
    dVar18 = auVar17._0_8_ + auVar17._16_8_ + auVar17._8_8_ + auVar17._24_8_;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"NORM: ",6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar18;
  auVar2 = vsqrtsd_avx(in_XMM5,auVar2);
  poVar9 = std::ostream::_M_insert<double>(auVar2._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void Model::project_weights(float radius) {
  static float* project_scratch = 0;
  if (!project_scratch)
    project_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->squared_l2norm(&project_scratch[pi]);
    ++pi;
  }
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += project_scratch[i];
  cerr << "NORM: " << sqrt(gg) << endl;
}